

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O2

void __thiscall
ADE_DEP_DPFSP::subCrossover(ADE_DEP_DPFSP *this,Permutazione *i1,Permutazione *i2,Permutazione *ris)

{
  ushort uVar1;
  unsigned_short i;
  uint uVar2;
  void *pvVar3;
  undefined2 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  unsigned_short i_2;
  ushort uVar9;
  unsigned_short i_1;
  ushort uVar10;
  undefined2 *local_48;
  
  uVar6 = (ulong)i1->dimensione;
  pvVar3 = operator_new__(uVar6);
  puVar4 = (undefined2 *)operator_new__((ulong)(this->istanza).fabbriche << 2);
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined1 *)((long)pvVar3 + uVar5) = 0;
  }
  uVar9 = 0;
  for (uVar10 = 0; uVar10 <= (ushort)uVar6; uVar10 = uVar10 + 1) {
    if ((uVar10 == (ushort)uVar6) || ((this->istanza).lavori <= i1->individuo[uVar10])) {
      if (uVar9 == 0) {
        iVar8 = 0;
        uVar5 = 0;
        local_48 = puVar4;
      }
      else {
        uVar5 = (ulong)uVar9;
        iVar8 = (ushort)puVar4[uVar5 - 1] + 1;
        local_48 = puVar4 + uVar5;
      }
      uVar2 = Random::randIntU(&genRand,iVar8,(uint)uVar10);
      *local_48 = (short)uVar2;
      puVar4[uVar5 + 1] = uVar10;
      for (uVar5 = (ulong)(uVar2 & 0xffff); uVar5 < uVar10; uVar5 = uVar5 + 1) {
        *(undefined1 *)((long)pvVar3 + (ulong)i1->individuo[uVar5]) = 1;
      }
      uVar9 = uVar9 + 2;
      uVar6 = (ulong)i1->dimensione;
    }
  }
  uVar6 = 0;
  uVar5 = 0;
  uVar9 = 0;
  while( true ) {
    uVar10 = i2->dimensione;
    if (uVar10 <= uVar9 && uVar9 != uVar10) break;
    uVar7 = uVar5 & 0xffff;
    iVar8 = (int)uVar7;
    if ((uVar9 == uVar10) || (uVar1 = i2->individuo[uVar9], (this->istanza).lavori <= uVar1)) {
      uVar1 = puVar4[uVar6 & 0xffff];
      if (puVar4[(uVar6 & 0xffff) + 1] != uVar1) {
        uVar2 = (uint)(ushort)puVar4[(uVar6 & 0xffff) + 1] - (uint)uVar1;
        memcpy((void *)((ulong)(uint)(iVar8 * 2) + (long)ris->individuo),
               (void *)((ulong)((uint)uVar1 * 2) + (long)i1->individuo),
               (ulong)((uVar2 & 0xffff) * 2));
        uVar5 = (ulong)(uVar2 + iVar8);
        uVar10 = i2->dimensione;
      }
      if (uVar9 != uVar10) {
        uVar7 = uVar5 & 0xffff;
        uVar5 = (ulong)((int)uVar5 + 1);
        ris->individuo[uVar7] = i2->individuo[uVar9];
      }
      uVar6 = (ulong)((int)uVar6 + 2);
    }
    else if (*(char *)((long)pvVar3 + (ulong)uVar1) == '\0') {
      uVar5 = (ulong)(iVar8 + 1);
      ris->individuo[uVar7] = uVar1;
    }
    uVar9 = uVar9 + 1;
  }
  operator_delete__(pvVar3);
  operator_delete__(puVar4);
  return;
}

Assistant:

void ADE_DEP_DPFSP::subCrossover(Permutazione* i1, Permutazione* i2, Permutazione* ris) {

	bool* daEliminare = new bool[i1->dimensione];
	unsigned short* indiceTagli = new unsigned short[istanza.fabbriche * 2];

	for (unsigned short i = 0; i < i1->dimensione; i++) {
		daEliminare[i] = false; 
	}

	unsigned short f = 0;

	for (unsigned short i = 0; i <= i1->dimensione; i++) {

		if (i1->individuo[i] >= istanza.lavori || i == i1->dimensione) {

			if (f == 0) indiceTagli[0] = genRand.randIntU(0, i);
			else indiceTagli[f] = genRand.randIntU(indiceTagli[f - 1] + 1, i);

			indiceTagli[f + 1] = i;

			for (unsigned short k = indiceTagli[f]; k < indiceTagli[f + 1]; k++) {
				daEliminare[i1->individuo[k]] = true;
			}

			f += 2;
		}
	}

	unsigned short scostamento = 0;

	f = 0;

	for (unsigned short i = 0; i <= i2->dimensione; i++) {

		if (i2->individuo[i] >= istanza.lavori || i == i2->dimensione) {
			unsigned short lunghezzaSegmento = indiceTagli[f + 1] - indiceTagli[f];
			if (lunghezzaSegmento > 0) {
				memcpy(&(ris->individuo[scostamento]), &(i1->individuo[indiceTagli[f]]),
					lunghezzaSegmento*sizeof(unsigned short));
				scostamento += lunghezzaSegmento;
			}

			if(i != i2->dimensione) ris->individuo[scostamento++] = i2->individuo[i];

			f += 2;
		}
		else if (!daEliminare[i2->individuo[i]]) {
			ris->individuo[scostamento++] = i2->individuo[i];
		}
	}

	delete[] daEliminare;
	delete[] indiceTagli;
}